

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

Result __thiscall
testing::internal::
FunctionMocker<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
::Invoke(FunctionMocker<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
         *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *args,Error *args_1)

{
  UntypedActionResultHolderBase *f;
  ActionResultHolder<void> *__p;
  pointer this_00;
  unique_ptr<testing::internal::ActionResultHolder<void>,_std::default_delete<testing::internal::ActionResultHolder<void>_>_>
  local_58;
  unique_ptr<testing::internal::ActionResultHolder<void>,_std::default_delete<testing::internal::ActionResultHolder<void>_>_>
  holder;
  ArgumentTuple tuple;
  Error *args_local_1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *args_local;
  FunctionMocker<void_(const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error)>
  *this_local;
  
  std::
  tuple<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
  ::
  tuple<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error,_true>
            ((tuple<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
              *)&holder,args,args_1);
  f = UntypedFunctionMockerBase::UntypedInvokeWith
                (&this->super_UntypedFunctionMockerBase,
                 (tuple<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
                  *)&holder);
  __p = DownCast_<testing::internal::ActionResultHolder<void>*,testing::internal::UntypedActionResultHolderBase>
                  (f);
  std::
  unique_ptr<testing::internal::ActionResultHolder<void>,std::default_delete<testing::internal::ActionResultHolder<void>>>
  ::unique_ptr<std::default_delete<testing::internal::ActionResultHolder<void>>,void>
            ((unique_ptr<testing::internal::ActionResultHolder<void>,std::default_delete<testing::internal::ActionResultHolder<void>>>
              *)&local_58,__p);
  this_00 = std::
            unique_ptr<testing::internal::ActionResultHolder<void>,_std::default_delete<testing::internal::ActionResultHolder<void>_>_>
            ::operator->(&local_58);
  ActionResultHolder<void>::Unwrap(this_00);
  std::
  unique_ptr<testing::internal::ActionResultHolder<void>,_std::default_delete<testing::internal::ActionResultHolder<void>_>_>
  ::~unique_ptr(&local_58);
  std::
  tuple<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
  ::~tuple((tuple<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_&,_ot::commissioner::Error>
            *)&holder);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    ArgumentTuple tuple(std::forward<Args>(args)...);
    std::unique_ptr<ResultHolder> holder(DownCast_<ResultHolder*>(
        this->UntypedInvokeWith(static_cast<void*>(&tuple))));
    return holder->Unwrap();
  }